

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bytearray.c
# Opt level: O3

adt_error_t adt_bytearray_push(adt_bytearray_t *self,uint8_t value)

{
  uint8_t *puVar1;
  adt_error_t aVar2;
  
  if (self == (adt_bytearray_t *)0x0) {
    aVar2 = '\x01';
  }
  else {
    aVar2 = adt_bytearray_reserve(self,self->u32CurLen + 1);
    if (aVar2 == '\0') {
      puVar1 = self->pData;
      if (puVar1 + self->u32AllocLen < puVar1 + (ulong)self->u32CurLen + 1) {
        __assert_fail("pNext + 1 <= pEnd",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_bytearray.c"
                      ,0x112,"adt_error_t adt_bytearray_push(adt_bytearray_t *, uint8_t)");
      }
      puVar1[self->u32CurLen] = value;
      self->u32CurLen = self->u32CurLen + 1;
      aVar2 = '\0';
    }
  }
  return aVar2;
}

Assistant:

adt_error_t adt_bytearray_push(adt_bytearray_t *self, uint8_t value)
{
   if(self != 0)
   {
      adt_error_t errorCode = adt_bytearray_reserve(self, self->u32CurLen + 1);
      if(errorCode == ADT_NO_ERROR)
      {
         uint8_t *pNext, *pEnd;
         pNext = self->pData + self->u32CurLen;
         pEnd = self->pData + self->u32AllocLen;
         assert(pNext + 1 <= pEnd);
         *pNext = value;
         self->u32CurLen++;
      }
      return errorCode;
   }
   return ADT_INVALID_ARGUMENT_ERROR;
}